

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadStringArray
          (CrateReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *d)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ssize_t sVar5;
  string *psVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  uint64_t n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  optional<tinyusdz::Token> v;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> ivalue;
  string s;
  ostringstream ss_e;
  uint64_t local_258;
  string *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_230;
  optional<tinyusdz::Token> local_228;
  _Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> local_200;
  string local_1e8 [8];
  long local_1e0;
  ostringstream local_1c8 [408];
  
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258 = 0;
  bVar2 = StreamReader::read8(this->_sr,&local_258);
  if (bVar2) {
    if ((this->_config).maxArrayElements < local_258) {
      ::std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"operator()");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3b6);
      ::std::operator<<(poVar3," ");
      pcVar7 = "Too many array elements.";
      goto LAB_0017cc8c;
    }
    uVar4 = local_258 * 4 + this->_memoryUsage;
    this->_memoryUsage = uVar4;
    if ((this->_config).maxMemoryBudget < uVar4) {
      ::std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"operator()");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3b9);
      ::std::operator<<(poVar3," ");
      pcVar7 = "Reached to max memory budget.";
      goto LAB_0017cc8c;
    }
    ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::vector
              ((vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *)&local_200
               ,local_258,(allocator_type *)local_1c8);
    sVar5 = StreamReader::read(this->_sr,(int)(void *)(local_258 << 2),(void *)(local_258 << 2),
                               (size_t)local_200._M_impl.super__Vector_impl_data._M_start);
    if (sVar5 == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"operator()");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3c0);
      ::std::operator<<(poVar3," ");
      pcVar7 = "Failed to read STRING_VECTOR data.";
    }
    else {
      uVar4 = local_258 * 8 + this->_memoryUsage;
      this->_memoryUsage = uVar4;
      if (uVar4 <= (this->_config).maxMemoryBudget) {
        local_230 = d;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&local_248,local_258);
        local_250 = (string *)&this->_err;
        lVar8 = 0;
        uVar4 = 0;
        while( true ) {
          if (local_258 <= uVar4) break;
          GetStringToken(&local_228,this,
                         (Index)local_200._M_impl.super__Vector_impl_data._M_start[uVar4].value);
          if (local_228.has_value_ == true) {
            psVar6 = (string *)nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_228);
            ::std::__cxx11::string::string(local_1e8,psVar6);
            uVar1 = (this->_config).maxMemoryBudget;
            uVar9 = this->_memoryUsage + local_1e0;
            this->_memoryUsage = uVar9;
            if (uVar1 < uVar9) {
              ::std::__cxx11::ostringstream::ostringstream(local_1c8);
              poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,"[Crate]");
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"operator()");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3ca);
              ::std::operator<<(poVar3," ");
              poVar3 = ::std::operator<<((ostream *)local_1c8,"Reached to max memory budget.");
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append(local_250);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
            }
            else {
              ::std::__cxx11::string::_M_assign
                        ((string *)
                         ((long)&((local_248.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8));
            }
            ::std::__cxx11::string::_M_dispose();
            if (uVar1 < uVar9) {
              nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_228);
              goto LAB_0017cf69;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1c8);
            poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"operator()");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3cd);
            ::std::operator<<(poVar3," ");
            poVar3 = ::std::operator<<((ostream *)local_1c8,"Invalid StringIndex.");
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append(local_250);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
          }
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_228);
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + 0x20;
        }
        ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
        ~_Vector_base(&local_200);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_230,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_248);
        bVar2 = true;
        goto LAB_0017ccdc;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"operator()");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3c5);
      ::std::operator<<(poVar3," ");
      pcVar7 = "Reached to max memory budget.";
    }
    poVar3 = ::std::operator<<((ostream *)local_1c8,pcVar7);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
LAB_0017cf69:
    ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
    ~_Vector_base(&local_200);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar3 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,"[Crate]");
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"operator()");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3b1);
    ::std::operator<<(poVar3," ");
    pcVar7 = "Failed to read the number of array elements.";
LAB_0017cc8c:
    poVar3 = ::std::operator<<((ostream *)local_1c8,pcVar7);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  bVar2 = false;
LAB_0017ccdc:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  return bVar2;
}

Assistant:

bool CrateReader::ReadStringArray(std::vector<std::string> *d) {
  // array data is not compressed
  auto ReadFn = [this](std::vector<std::string> &result) -> bool {
    uint64_t n{0};
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    if (n > _config.maxArrayElements) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
    }

    CHECK_MEMORY_USAGE(size_t(n) * sizeof(crate::Index));

    std::vector<crate::Index> ivalue(static_cast<size_t>(n));

    if (!_sr->read(size_t(n) * sizeof(crate::Index),
                   size_t(n) * sizeof(crate::Index),
                   reinterpret_cast<uint8_t *>(ivalue.data()))) {
      PUSH_ERROR("Failed to read STRING_VECTOR data.");
      return false;
    }

    // reconstruct
    CHECK_MEMORY_USAGE(size_t(n) * sizeof(void *));
    result.resize(static_cast<size_t>(n));
    for (size_t i = 0; i < n; i++) {
      if (auto v = GetStringToken(ivalue[i])) {
        std::string s = v.value().str();
        CHECK_MEMORY_USAGE(s.size());
        result[i] = s;
      } else {
        PUSH_ERROR("Invalid StringIndex.");
      }
    }

    return true;
  };

  std::vector<std::string> items;
  if (!ReadFn(items)) {
    return false;
  }

  (*d) = items;

  return true;
}